

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O0

void LDSketch_write_plaintext(LDSketch_t *sk,char *outfile)

{
  undefined8 uVar1;
  uint uVar2;
  FILE *__stream;
  char *in_RSI;
  long *in_RDI;
  uint index;
  uint k;
  uchar *key;
  uint64_t key_int;
  int j;
  int i;
  FILE *fp;
  int local_20;
  int local_1c;
  
  __stream = fopen(in_RSI,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"ERR: cannot open %s\n",in_RSI);
    exit(-1);
  }
  fprintf(__stream,"Worker: %u, length of key: %d\n",(ulong)*(uint *)(in_RDI + 4),
          (ulong)*(uint *)((long)in_RDI + 0x14));
  fprintf(__stream,"# of hash row: %d\n",(ulong)*(uint *)(in_RDI + 1));
  fprintf(__stream,"# of buckets: %d\n",(ulong)*(uint *)((long)in_RDI + 0xc));
  for (local_1c = 0; local_1c < (int)in_RDI[1]; local_1c = local_1c + 1) {
    uVar2 = LDSketch_find((LDSketch_t *)fp,_j,key_int._4_4_,(int)key_int,key._4_4_);
    fprintf(__stream,"%u ",(ulong)uVar2);
  }
  fprintf(__stream,"\n");
  for (local_1c = 0; local_1c < (int)in_RDI[1]; local_1c = local_1c + 1) {
    for (local_20 = 0; local_20 < *(int *)((long)in_RDI + 0xc); local_20 = local_20 + 1) {
      uVar1 = *(undefined8 *)
               (*(long *)(*in_RDI +
                         (ulong)(uint)(*(int *)((long)in_RDI + 0xc) * local_1c + local_20) * 8) +
               0x38);
      uVar2 = dyn_tbl_length((dyn_tbl_t *)0x107431);
      fprintf(__stream,"%lld %d, ",uVar1,(ulong)uVar2);
    }
    fprintf(__stream,"\n");
  }
  fclose(__stream);
  return;
}

Assistant:

void LDSketch_write_plaintext(LDSketch_t* sk, const char* outfile) {
	FILE* fp;
	int i, j;

	// open a file
	if ((fp = fopen(outfile, "w")) == NULL) {
		fprintf(stderr, "ERR: cannot open %s\n", outfile);
		exit(-1);
	}

	// write to a file (including n and bd???)
	fprintf(fp, "Worker: %u, length of key: %d\n", sk->tbl_id, sk->lgn);
	fprintf(fp, "# of hash row: %d\n", sk->h);
	fprintf(fp, "# of buckets: %d\n", sk->w);

	uint64_t key_int = 0x0102030405060708;
	unsigned char* key = (unsigned char*)&key_int;
	for (i = 0; i < sk->h; ++i) {
		unsigned int k = LDSketch_find(sk, key, 0, sk->lgn - 1, i);
		fprintf(fp, "%u ", k);
	}
	fprintf(fp, "\n");

	for (i = 0; i < sk->h; ++i) {
		for (j = 0; j < sk->w; ++j) {
			// fprintf(fp, "%lld ", tbl->T[tbl->w*i + j]);
			unsigned int index = sk->w * i + j;
			fprintf(fp, "%lld %d, ", sk->tbl[index]->total,
				dyn_tbl_length(sk->tbl[index]));
		}
		fprintf(fp, "\n");
	}

	// close the file
	fclose(fp);
}